

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O1

void __thiscall ParseUint64_Overflow_Test::TestBody(ParseUint64_Overflow_Test *this)

{
  anon_unknown.dwarf_b78f2::AssertUint64Fails("0x10000000000000000");
  anon_unknown.dwarf_b78f2::AssertUint64Fails("18446744073709551616");
  anon_unknown.dwarf_b78f2::AssertUint64Fails("62857453058642199420");
  anon_unknown.dwarf_b78f2::AssertUint64Fails("82000999361882825820");
  anon_unknown.dwarf_b78f2::AssertUint64Fails("126539114687237086210");
  anon_unknown.dwarf_b78f2::AssertUint64Fails("10000000000000000000000000000000000000000");
  return;
}

Assistant:

TEST(ParseUint64, Overflow) {
  AssertUint64Fails("0x10000000000000000");
  AssertUint64Fails("18446744073709551616");
  AssertUint64Fails("62857453058642199420");
  AssertUint64Fails("82000999361882825820");
  AssertUint64Fails("126539114687237086210");
  AssertUint64Fails("10000000000000000000000000000000000000000");
}